

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlOutputBufferWriteEscape
              (xmlOutputBufferPtr out,xmlChar *str,xmlCharEncodingOutputFunc escaping)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  xmlChar *__s;
  int c_in;
  int c_out;
  xmlChar buf [1024];
  int local_44c;
  int local_448;
  int local_444;
  xmlOutputBufferPtr local_440;
  uchar local_438 [1032];
  
  iVar3 = -1;
  if (out == (xmlOutputBufferPtr)0x0) {
    return -1;
  }
  if (str == (xmlChar *)0x0) {
    return -1;
  }
  if (out->error != 0) {
    return -1;
  }
  sVar4 = strlen((char *)str);
  if (sVar4 < 0x7fffffff) {
    if (escaping != (xmlCharEncodingOutputFunc)0x0) {
      local_44c = 0;
      local_440 = out;
      do {
        if (sVar4 == 0) {
          return local_44c;
        }
        local_444 = 0x400;
        local_448 = (int)sVar4;
        iVar2 = (*escaping)(local_438,&local_444,str,&local_448);
        if (iVar2 < 0) {
          local_440->error = 2;
          iVar3 = -1;
          bVar1 = false;
        }
        else {
          str = str + local_448;
          sVar4 = sVar4 - (long)local_448;
          iVar2 = xmlOutputBufferWrite(local_440,local_444,(char *)local_438);
          if (iVar2 < 0) {
            bVar1 = false;
            iVar3 = iVar2;
          }
          else {
            local_44c = local_44c + iVar2;
            bVar1 = true;
          }
        }
      } while (bVar1);
      return iVar3;
    }
    __s = xmlEscapeText(str,0x10);
    if (__s == (xmlChar *)0x0) {
      out->error = 2;
      return -1;
    }
    sVar4 = strlen((char *)__s);
    if (sVar4 < 0x7fffffff) {
      iVar3 = xmlOutputBufferWrite(out,(int)sVar4,(char *)__s);
      (*xmlFree)(__s);
      return iVar3;
    }
  }
  out->error = 0x72;
  return -1;
}

Assistant:

int
xmlOutputBufferWriteEscape(xmlOutputBufferPtr out, const xmlChar *str,
                           xmlCharEncodingOutputFunc escaping) {
    int ret;
    int written = 0;
    size_t len;

    if ((out == NULL) || (out->error) || (str == NULL))
        return(-1);

    len = strlen((const char *) str);
    if (len >= INT_MAX) {
        out->error = XML_ERR_RESOURCE_LIMIT;
        return(-1);
    }

    if (escaping == NULL) {
        char *escaped = (char *) xmlEscapeText(str, XML_ESCAPE_ALLOW_INVALID);

        if (escaped == NULL) {
            out->error = XML_ERR_NO_MEMORY;
            return(-1);
        }

        len = strlen(escaped);
        if (len >= INT_MAX) {
            out->error = XML_ERR_RESOURCE_LIMIT;
            return(-1);
        }

        ret = xmlOutputBufferWrite(out, len, escaped);

        xmlFree(escaped);
        return(ret);
    }

    while (len > 0) {
        xmlChar buf[1024];
        int c_out;
        int c_in;

	c_out = 1024;
	c_in = len;

        ret = escaping(buf, &c_out, str, &c_in);
        if (ret < 0) {
            out->error = XML_ERR_NO_MEMORY;
            return(-1);
        }
        str += c_in;
        len -= c_in;

        ret = xmlOutputBufferWrite(out, c_out, (char *) buf);
        if (ret < 0)
            return(ret);
        written += ret;
    }

    return(written);
}